

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

int __thiscall ncnn::ParamDict::load_param(ParamDict *this,DataReader *dr)

{
  int *piVar1;
  Allocator *pAVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  void *pvVar7;
  char *pcVar8;
  size_t sVar9;
  Mat *pMVar10;
  long lVar11;
  int id;
  int len;
  char vstr [16];
  int local_50;
  int local_4c;
  void *local_48 [3];
  
  clear(this);
  local_50 = 0;
  iVar4 = (**(code **)(*(long *)dr + 0x10))(dr,"%d=");
  if (iVar4 == 1) {
    do {
      if (local_50 < -0x5b03) {
        local_50 = -0x5b04 - local_50;
        local_4c = 0;
        iVar5 = (**(code **)(*(long *)dr + 0x10))(dr,"%d",&local_4c);
        iVar4 = local_4c;
        if (iVar5 != 1) {
          load_param();
          return -1;
        }
        lVar6 = (long)local_50;
        if ((((this->params[lVar6].v.dims != 1) || (this->params[lVar6].v.w != local_4c)) ||
            (this->params[lVar6].v.elemsize != 4)) ||
           ((this->params[lVar6].v.elempack != 1 ||
            (this->params[lVar6].v.allocator != (Allocator *)0x0)))) {
          pMVar10 = &this->params[lVar6].v;
          piVar1 = this->params[lVar6].v.refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              pAVar2 = this->params[lVar6].v.allocator;
              if (pAVar2 == (Allocator *)0x0) {
                if (pMVar10->data != (void *)0x0) {
                  free(pMVar10->data);
                }
              }
              else {
                (**(code **)(*(long *)pAVar2 + 0x18))();
              }
            }
          }
          sVar9 = (size_t)iVar4;
          pMVar10->data = (void *)0x0;
          this->params[lVar6].v.refcount = (int *)0x0;
          this->params[lVar6].v.elemsize = 4;
          this->params[lVar6].v.elempack = 1;
          this->params[lVar6].v.allocator = (Allocator *)0x0;
          this->params[lVar6].v.dims = 1;
          this->params[lVar6].v.w = iVar4;
          this->params[lVar6].v.h = 1;
          this->params[lVar6].v.c = 1;
          this->params[lVar6].v.cstep = sVar9;
          if (iVar4 != 0) {
            local_48[0] = (void *)0x0;
            iVar4 = posix_memalign(local_48,0x10,sVar9 * 4 + 4);
            pvVar7 = (void *)0x0;
            if (iVar4 == 0) {
              pvVar7 = local_48[0];
            }
            pMVar10->data = pvVar7;
            piVar1 = (int *)((long)pvVar7 + sVar9 * 4);
            this->params[lVar6].v.refcount = piVar1;
            *piVar1 = 1;
          }
        }
        if (0 < local_4c) {
          lVar11 = 0;
          lVar6 = 0;
          do {
            iVar4 = (**(code **)(*(long *)dr + 0x10))(dr,",%15[^,\n ]",local_48);
            if (iVar4 != 1) {
              load_param();
              return -1;
            }
            bVar3 = vstr_is_float((char *)local_48);
            if (bVar3) {
              pcVar8 = "%f";
            }
            else {
              pcVar8 = "%d";
            }
            iVar4 = __isoc99_sscanf(local_48,pcVar8,(long)this->params[local_50].v.data + lVar11);
            if (iVar4 != 1) {
              load_param();
              return -1;
            }
            this->params[local_50].type = bVar3 + 5;
            lVar6 = lVar6 + 1;
            lVar11 = lVar11 + 4;
          } while (lVar6 < local_4c);
        }
      }
      else {
        iVar4 = (**(code **)(*(long *)dr + 0x10))(dr,"%15s",local_48);
        if (iVar4 != 1) {
          load_param();
          return -1;
        }
        bVar3 = vstr_is_float((char *)local_48);
        pcVar8 = "%d";
        if (bVar3) {
          pcVar8 = "%f";
        }
        iVar4 = __isoc99_sscanf(local_48,pcVar8,&this->params[local_50].field_1);
        if (iVar4 != 1) {
          load_param();
          return -1;
        }
        this->params[local_50].type = bVar3 | 2;
      }
      iVar4 = (**(code **)(*(long *)dr + 0x10))(dr,"%d=",&local_50);
    } while (iVar4 == 1);
  }
  return 0;
}

Assistant:

int ParamDict::load_param(const DataReader& dr)
{
    clear();

//     0=100 1=1.250000 -23303=5,0.1,0.2,0.4,0.8,1.0

    // parse each key=value pair
    int id = 0;
    while (dr.scan("%d=", &id) == 1)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = 0;
            int nscan = dr.scan("%d", &len);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict read array length failed\n");
                return -1;
            }

            params[id].v.create(len);

            for (int j = 0; j < len; j++)
            {
                char vstr[16];
                nscan = dr.scan(",%15[^,\n ]", vstr);
                if (nscan != 1)
                {
                    fprintf(stderr, "ParamDict read array element failed\n");
                    return -1;
                }

                bool is_float = vstr_is_float(vstr);

                if (is_float)
                {
                    float* ptr = params[id].v;
                    nscan = sscanf(vstr, "%f", &ptr[j]);
                }
                else
                {
                    int* ptr = params[id].v;
                    nscan = sscanf(vstr, "%d", &ptr[j]);
                }
                if (nscan != 1)
                {
                    fprintf(stderr, "ParamDict parse array element failed\n");
                    return -1;
                }

                params[id].type = is_float ? 6 : 5;
            }
        }
        else
        {
            char vstr[16];
            int nscan = dr.scan("%15s", vstr);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict read value failed\n");
                return -1;
            }

            bool is_float = vstr_is_float(vstr);

            if (is_float)
                nscan = sscanf(vstr, "%f", &params[id].f);
            else
                nscan = sscanf(vstr, "%d", &params[id].i);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict parse value failed\n");
                return -1;
            }

            params[id].type = is_float ? 3 : 2;
        }
    }

    return 0;
}